

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_transform.cc
# Opt level: O1

bool __thiscall
draco::AttributeTransform::TransferToAttribute(AttributeTransform *this,PointAttribute *attribute)

{
  AttributeTransformData *pAVar1;
  pointer __p;
  AttributeTransformData *pAVar2;
  pointer *__ptr;
  unique_ptr<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
  transform_data;
  AttributeTransformData *local_28;
  AttributeTransformData *local_20;
  
  pAVar2 = (AttributeTransformData *)operator_new(0x30);
  pAVar2->transform_type_ = ATTRIBUTE_INVALID_TRANSFORM;
  DataBuffer::DataBuffer(&pAVar2->buffer_);
  local_28 = pAVar2;
  (*this->_vptr_AttributeTransform[4])(this,pAVar2);
  pAVar1 = local_28;
  local_28 = (AttributeTransformData *)0x0;
  local_20 = (AttributeTransformData *)0x0;
  pAVar2 = (attribute->attribute_transform_data_)._M_t.
           super___uniq_ptr_impl<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
           ._M_t.
           super__Tuple_impl<0UL,_draco::AttributeTransformData_*,_std::default_delete<draco::AttributeTransformData>_>
           .super__Head_base<0UL,_draco::AttributeTransformData_*,_false>._M_head_impl;
  (attribute->attribute_transform_data_)._M_t.
  super___uniq_ptr_impl<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
  ._M_t.
  super__Tuple_impl<0UL,_draco::AttributeTransformData_*,_std::default_delete<draco::AttributeTransformData>_>
  .super__Head_base<0UL,_draco::AttributeTransformData_*,_false>._M_head_impl = pAVar1;
  if (pAVar2 != (AttributeTransformData *)0x0) {
    std::default_delete<draco::AttributeTransformData>::operator()
              ((default_delete<draco::AttributeTransformData> *)
               &attribute->attribute_transform_data_,pAVar2);
  }
  if (local_20 != (AttributeTransformData *)0x0) {
    std::default_delete<draco::AttributeTransformData>::operator()
              ((default_delete<draco::AttributeTransformData> *)&local_20,local_20);
  }
  local_20 = (AttributeTransformData *)0x0;
  if (local_28 != (AttributeTransformData *)0x0) {
    std::default_delete<draco::AttributeTransformData>::operator()
              ((default_delete<draco::AttributeTransformData> *)&local_28,local_28);
  }
  return true;
}

Assistant:

bool AttributeTransform::TransferToAttribute(PointAttribute *attribute) const {
  std::unique_ptr<AttributeTransformData> transform_data(
      new AttributeTransformData());
  this->CopyToAttributeTransformData(transform_data.get());
  attribute->SetAttributeTransformData(std::move(transform_data));
  return true;
}